

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *
__thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>::insert
          (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
           *this,pair<unsigned_long,_float> *value)

{
  float fVar1;
  pointer pNVar2;
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *pNVar3
  ;
  size_t sVar4;
  size_t sVar5;
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *pNVar6
  ;
  ulong uVar7;
  size_t *psVar8;
  pointer pNVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  fVar1 = (this->_value).second;
  if (value->second <= fVar1 && fVar1 != value->second) {
    return (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
            *)0x0;
  }
  lVar12 = (long)(this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    lVar13 = 1 - (lVar12 >> 4);
    do {
      pNVar6 = *(Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                 **)((long)&(this->_nodeRefs)._nodes.
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar12);
      if ((pNVar6 != (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                      *)0x0) &&
         (pNVar6 = insert(pNVar6,value),
         pNVar6 != (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                    *)0x0)) {
        uVar14 = -lVar13;
        goto LAB_004ec344;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + -0x10;
    } while (lVar13 != 1);
  }
  pNVar6 = _Pool::Allocate(this->_pool,value);
  uVar14 = 0;
LAB_004ec344:
  uVar7 = (pNVar6->_nodeRefs)._swapLevel;
  pNVar9 = (pNVar6->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(pNVar6->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 4;
  pNVar2 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar7 < uVar10) {
    if (uVar14 < uVar7) {
      pNVar9[uVar7].width = pNVar9[uVar7].width + pNVar2[uVar14].width;
      uVar14 = uVar14 + 1;
    }
    uVar11 = (long)(this->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4;
    if (uVar10 < uVar11) {
      uVar11 = uVar10;
    }
    lVar12 = uVar11 - uVar14;
    if (uVar14 <= uVar11 && lVar12 != 0) {
      uVar15 = uVar14 << 4 | 8;
      do {
        pNVar2 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&pNVar2->pNode + uVar15) =
             (*(long *)((long)&pNVar2->pNode + uVar15) - *(long *)((long)&pNVar9->pNode + uVar15)) +
             1;
        pNVar3 = pNVar2[uVar7].pNode;
        sVar4 = pNVar2[uVar7].width;
        sVar5 = pNVar9[uVar7].width;
        pNVar2[uVar7].pNode = pNVar9[uVar7].pNode;
        pNVar2[uVar7].width = sVar5;
        pNVar9 = (pNVar6->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pNVar6->_nodeRefs)._swapLevel;
        pNVar9->pNode = pNVar3;
        pNVar9->width = sVar4;
        uVar7 = (pNVar6->_nodeRefs)._swapLevel + 1;
        (pNVar6->_nodeRefs)._swapLevel = uVar7;
        pNVar9 = (pNVar6->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(pNVar6->_nodeRefs)._nodes.
                       super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 4;
        if (uVar7 < uVar10) {
          pNVar9[uVar7].width =
               *(size_t *)
                ((long)&((this->_nodeRefs)._nodes.
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pNode + uVar15);
        }
        uVar15 = uVar15 + 0x10;
        lVar12 = lVar12 + -1;
        uVar14 = uVar11;
      } while (lVar12 != 0);
    }
    if (uVar10 <= uVar7) {
      pNVar9 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 4;
      lVar12 = uVar7 - uVar14;
      pNVar6 = this;
      if (uVar14 <= uVar7 && lVar12 != 0) {
        psVar8 = &pNVar9[uVar14].width;
        do {
          *psVar8 = *psVar8 + 1;
          psVar8 = psVar8 + 2;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
    }
  }
  else {
    uVar14 = (long)(this->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4;
    lVar12 = uVar14 - uVar10;
    pNVar6 = this;
    if (uVar10 <= uVar14 && lVar12 != 0) {
      psVar8 = &pNVar2[uVar10].width;
      do {
        *psVar8 = *psVar8 + 1;
        psVar8 = psVar8 + 2;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
  }
  return pNVar6;
}

Assistant:

inline bool operator()(const T &lhi, const T &rhi) const {
		return lhi.second < rhi.second;
	}